

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_grid.c
# Opt level: O0

REF_STATUS
ref_grid_compact_surf_id_nodes
          (REF_GRID ref_grid,REF_INT cell_id,REF_GLOB *nnode_global,REF_LONG *ncell_global,
          REF_GLOB **l2c)

{
  REF_NODE ref_node_00;
  REF_MPI ref_mpi_00;
  REF_STATUS RVar1;
  uint uVar2;
  REF_GLOB *pRVar3;
  void *array;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT ref_malloc_init_i;
  REF_CELL ref_cell;
  REF_INT group;
  REF_INT offset;
  REF_INT *counts;
  int local_d0;
  REF_INT proc;
  REF_INT ncell;
  REF_INT nnode;
  REF_INT nodes [27];
  int local_54;
  REF_INT part;
  REF_INT cell_node;
  REF_INT node;
  REF_INT cell;
  REF_MPI ref_mpi;
  REF_NODE ref_node;
  REF_GLOB **l2c_local;
  REF_LONG *ncell_global_local;
  REF_GLOB *nnode_global_local;
  REF_INT cell_id_local;
  REF_GRID ref_grid_local;
  
  ref_node_00 = ref_grid->node;
  ref_mpi_00 = ref_grid->mpi;
  if (ref_node_00->max < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",0x25f,
           "ref_grid_compact_surf_id_nodes","malloc *l2c of REF_GLOB negative");
    ref_grid_local._4_4_ = 1;
  }
  else {
    pRVar3 = (REF_GLOB *)malloc((long)ref_node_00->max << 3);
    *l2c = pRVar3;
    if (*l2c == (REF_GLOB *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",0x25f,
             "ref_grid_compact_surf_id_nodes","malloc *l2c of REF_GLOB NULL");
      ref_grid_local._4_4_ = 2;
    }
    else {
      for (ref_private_macro_code_rss_1 = 0; ref_private_macro_code_rss_1 < ref_node_00->max;
          ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + 1) {
        (*l2c)[ref_private_macro_code_rss_1] = -1;
      }
      *nnode_global = 0;
      *ncell_global = 0;
      proc = 0;
      local_d0 = 0;
      ref_cell._0_4_ = 3;
      _ref_private_macro_code_rss = ref_grid->cell[3];
      while ((int)ref_cell < 8) {
        for (cell_node = 0; cell_node < _ref_private_macro_code_rss->max; cell_node = cell_node + 1)
        {
          RVar1 = ref_cell_nodes(_ref_private_macro_code_rss,cell_node,&ncell);
          if ((RVar1 == 0) && (cell_id == (&ncell)[_ref_private_macro_code_rss->node_per])) {
            uVar2 = ref_cell_part(_ref_private_macro_code_rss,ref_node_00,cell_node,nodes + 0x1a);
            if (uVar2 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c"
                     ,0x269,"ref_grid_compact_surf_id_nodes",(ulong)uVar2,"part");
              return uVar2;
            }
            if (ref_mpi_00->id == nodes[0x1a]) {
              local_d0 = local_d0 + 1;
            }
            for (local_54 = 0; local_54 < _ref_private_macro_code_rss->node_per;
                local_54 = local_54 + 1) {
              if ((ref_node_00->ref_mpi->id == ref_node_00->part[(&ncell)[local_54]]) &&
                 ((*l2c)[(&ncell)[local_54]] == -1)) {
                (*l2c)[(&ncell)[local_54]] = (long)proc;
                proc = proc + 1;
              }
            }
          }
        }
        ref_cell._0_4_ = (int)ref_cell + 1;
        _ref_private_macro_code_rss = ref_grid->cell[(int)ref_cell];
      }
      *ncell_global = (long)local_d0;
      ref_grid_local._4_4_ = ref_mpi_allsum(ref_mpi_00,ncell_global,1,2);
      if (ref_grid_local._4_4_ == 0) {
        if (ref_mpi_00->n < 0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",
                 0x27b,"ref_grid_compact_surf_id_nodes","malloc counts of REF_INT negative");
          ref_grid_local._4_4_ = 1;
        }
        else {
          array = malloc((long)ref_mpi_00->n << 2);
          if (array == (void *)0x0) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",
                   0x27b,"ref_grid_compact_surf_id_nodes","malloc counts of REF_INT NULL");
            ref_grid_local._4_4_ = 2;
          }
          else {
            ref_grid_local._4_4_ = ref_mpi_allgather(ref_mpi_00,&proc,array,1);
            if (ref_grid_local._4_4_ == 0) {
              ref_cell._4_4_ = 0;
              for (counts._4_4_ = 0; counts._4_4_ < ref_mpi_00->id; counts._4_4_ = counts._4_4_ + 1)
              {
                ref_cell._4_4_ = *(int *)((long)array + (long)counts._4_4_ * 4) + ref_cell._4_4_;
              }
              for (counts._4_4_ = 0; counts._4_4_ < ref_mpi_00->n; counts._4_4_ = counts._4_4_ + 1)
              {
                *nnode_global = (long)*(int *)((long)array + (long)counts._4_4_ * 4) + *nnode_global
                ;
              }
              if (array != (void *)0x0) {
                free(array);
              }
              for (part = 0; part < ref_node_00->max; part = part + 1) {
                if ((*l2c)[part] != -1) {
                  (*l2c)[part] = (long)ref_cell._4_4_ + (*l2c)[part];
                }
              }
              ref_grid_local._4_4_ = ref_node_ghost_glob(ref_node_00,*l2c,1);
              if (ref_grid_local._4_4_ == 0) {
                ref_grid_local._4_4_ = 0;
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c"
                       ,0x28a,"ref_grid_compact_surf_id_nodes",(ulong)ref_grid_local._4_4_,"xfer");
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c"
                     ,0x27c,"ref_grid_compact_surf_id_nodes",(ulong)ref_grid_local._4_4_,
                     "gather size");
            }
          }
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",
               0x279,"ref_grid_compact_surf_id_nodes",(ulong)ref_grid_local._4_4_,"allsum");
      }
    }
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_grid_compact_surf_id_nodes(REF_GRID ref_grid,
                                                  REF_INT cell_id,
                                                  REF_GLOB *nnode_global,
                                                  REF_LONG *ncell_global,
                                                  REF_GLOB **l2c) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_INT cell, node, cell_node, part;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT nnode, ncell;
  REF_INT proc, *counts;
  REF_INT offset, group;
  REF_CELL ref_cell;

  ref_malloc_init(*l2c, ref_node_max(ref_node), REF_GLOB, REF_EMPTY);

  (*nnode_global) = 0;
  (*ncell_global) = 0;
  nnode = 0;
  ncell = 0;

  each_ref_grid_2d_ref_cell(ref_grid, group,
                            ref_cell){each_ref_cell_valid_cell_with_nodes(
      ref_cell, cell, nodes){if (cell_id == nodes[ref_cell_id_index(ref_cell)]){
      RSS(ref_cell_part(ref_cell, ref_node, cell, &part), "part");
  if (ref_mpi_rank(ref_mpi) == part) {
    ncell++;
  }
  each_ref_cell_cell_node(ref_cell, cell_node) {
    if (ref_node_owned(ref_node, nodes[cell_node]) &&
        (REF_EMPTY == (*l2c)[nodes[cell_node]])) {
      (*l2c)[nodes[cell_node]] = nnode;
      nnode++;
    }
  }
}
}
}

(*ncell_global) = ncell;
RSS(ref_mpi_allsum(ref_mpi, ncell_global, 1, REF_LONG_TYPE), "allsum");

ref_malloc(counts, ref_mpi_n(ref_mpi), REF_INT);
RSS(ref_mpi_allgather(ref_mpi, &nnode, counts, REF_INT_TYPE), "gather size");
offset = 0;
for (proc = 0; proc < ref_mpi_rank(ref_mpi); proc++) {
  offset += counts[proc];
}
each_ref_mpi_part(ref_mpi, proc) { (*nnode_global) += counts[proc]; }